

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

IntRect * __thiscall
ClipperLib::ClipperBase::GetBounds(IntRect *__return_storage_ptr__,ClipperBase *this)

{
  TEdge *pTVar1;
  LocalMinima *pLVar2;
  long lVar3;
  TEdge *pTVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  TEdge *pTVar8;
  long lVar9;
  long lVar10;
  
  pLVar2 = this->m_MinimaList;
  if (pLVar2 == (LocalMinima *)0x0) {
    __return_storage_ptr__->right = 0;
    __return_storage_ptr__->bottom = 0;
    __return_storage_ptr__->left = 0;
    __return_storage_ptr__->top = 0;
    return __return_storage_ptr__;
  }
  pTVar1 = pLVar2->leftBound;
  lVar5 = pTVar1->xbot;
  __return_storage_ptr__->left = lVar5;
  lVar3 = pTVar1->ybot;
  __return_storage_ptr__->top = lVar3;
  __return_storage_ptr__->right = lVar5;
  __return_storage_ptr__->bottom = lVar3;
  lVar6 = lVar3;
  lVar7 = lVar5;
  for (; pLVar2 != (LocalMinima *)0x0; pLVar2 = pLVar2->next) {
    pTVar1 = pLVar2->leftBound;
    lVar10 = pTVar1->ybot;
    pTVar4 = pTVar1;
    lVar9 = lVar7;
    pTVar8 = pTVar1;
    if (lVar6 < lVar10) {
      __return_storage_ptr__->bottom = lVar10;
      lVar6 = lVar10;
    }
    while( true ) {
      for (; lVar10 = pTVar4->xbot, pTVar4->nextInLML != (TEdge *)0x0; pTVar4 = pTVar4->nextInLML) {
        if (lVar10 < lVar9) {
          __return_storage_ptr__->left = lVar10;
          lVar7 = lVar10;
          lVar9 = lVar10;
          lVar10 = pTVar4->xbot;
        }
        if (lVar5 < lVar10) {
          __return_storage_ptr__->right = lVar10;
          lVar5 = lVar10;
        }
      }
      if (lVar10 < lVar9) {
        __return_storage_ptr__->left = lVar10;
        lVar9 = lVar10;
        lVar7 = lVar10;
        lVar10 = pTVar4->xbot;
      }
      if (lVar5 < lVar10) {
        __return_storage_ptr__->right = lVar10;
        lVar5 = lVar10;
      }
      lVar10 = pTVar4->xtop;
      if (lVar10 < lVar9) {
        __return_storage_ptr__->left = lVar10;
        lVar7 = lVar10;
        lVar9 = lVar10;
        lVar10 = pTVar4->xtop;
      }
      if (lVar5 < lVar10) {
        __return_storage_ptr__->right = lVar10;
        lVar5 = lVar10;
      }
      lVar10 = pTVar4->ytop;
      if (lVar10 < lVar3) {
        __return_storage_ptr__->top = lVar10;
        lVar3 = lVar10;
      }
      if (pTVar8 != pTVar1) break;
      pTVar4 = pLVar2->rightBound;
      pTVar8 = pLVar2->rightBound;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IntRect ClipperBase::GetBounds()
{
  IntRect result;
  LocalMinima* lm = m_MinimaList;
  if (!lm)
  {
    result.left = result.top = result.right = result.bottom = 0;
    return result;
  }
  result.left = lm->leftBound->xbot;
  result.top = lm->leftBound->ybot;
  result.right = lm->leftBound->xbot;
  result.bottom = lm->leftBound->ybot;
  while (lm)
  {
    if (lm->leftBound->ybot > result.bottom)
      result.bottom = lm->leftBound->ybot;
    TEdge* e = lm->leftBound;
    for (;;) {
      TEdge* bottomE = e;
      while (e->nextInLML)
      {
        if (e->xbot < result.left) result.left = e->xbot;
        if (e->xbot > result.right) result.right = e->xbot;
        e = e->nextInLML;
      }
      if (e->xbot < result.left) result.left = e->xbot;
      if (e->xbot > result.right) result.right = e->xbot;
      if (e->xtop < result.left) result.left = e->xtop;
      if (e->xtop > result.right) result.right = e->xtop;
      if (e->ytop < result.top) result.top = e->ytop;

      if (bottomE == lm->leftBound) e = lm->rightBound;
      else break;
    }
    lm = lm->next;
  }
  return result;
}